

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_feature_filter.cpp
# Opt level: O0

bool __thiscall
Fossilize::FeatureFilter::Impl::shader_module_is_supported
          (Impl *this,VkShaderModuleCreateInfo *info)

{
  bool bVar1;
  VkShaderModuleCreateFlags supported_flags;
  VkShaderModuleCreateInfo *info_local;
  Impl *this_local;
  
  if (info->flags == 0) {
    if ((this->null_device & 1U) == 0) {
      bVar1 = validate_module_capabilities(this,info->pCode,info->codeSize);
      if (bVar1) {
        this_local._7_1_ = pnext_chain_is_supported(this,info->pNext);
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool FeatureFilter::Impl::shader_module_is_supported(const VkShaderModuleCreateInfo *info) const
{
	// Only allow flags we recognize and validate.
	constexpr VkShaderModuleCreateFlags supported_flags = 0;
	if ((info->flags & ~supported_flags) != 0)
		return false;

	if (null_device)
		return true;

	if (!validate_module_capabilities(info->pCode, info->codeSize))
		return false;

	return pnext_chain_is_supported(info->pNext);
}